

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::add(parser *this,string *name,char short_name,string *desc)

{
  size_type sVar1;
  cmdline_error *this_00;
  option_without_value *this_01;
  mapped_type *ppoVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *desc_local;
  string *psStack_18;
  char short_name_local;
  string *name_local;
  parser *this_local;
  
  local_28 = desc;
  desc_local._7_1_ = short_name;
  psStack_18 = name;
  name_local = (string *)this;
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(&this->options,name);
  if (sVar1 != 0) {
    this_00 = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(&local_48,"multiple definition: ",psStack_18);
    cmdline_error::cmdline_error(this_00,&local_48);
    __cxa_throw(this_00,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  this_01 = (option_without_value *)operator_new(0x58);
  option_without_value::option_without_value(this_01,psStack_18,desc_local._7_1_,local_28);
  ppoVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,psStack_18);
  *ppoVar2 = (mapped_type)this_01;
  ppoVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[](&this->options,psStack_18);
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back(&this->ordered,ppoVar2);
  return;
}

Assistant:

void add(const std::string
            &name,
            char short_name = 0,
            const std::string
            &desc = ""){
                if (options.count(name)) throw
                cmdline_error("multiple definition: " + name);
                options[name] = new
                option_without_value(name, short_name, desc);
                ordered.push_back(options[name]);
            }